

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O1

void cmGccDepfile_yy_switch_to_buffer(YY_BUFFER_STATE_conflict new_buffer,yyscan_t yyscanner)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  YY_BUFFER_STATE_conflict pyVar4;
  yyguts_t_conflict *yyg;
  
  cmGccDepfile_yyensure_buffer_stack(yyscanner);
  lVar1 = *(long *)((long)yyscanner + 0x28);
  if (lVar1 == 0) {
    pyVar4 = (YY_BUFFER_STATE_conflict)0x0;
  }
  else {
    pyVar4 = *(YY_BUFFER_STATE_conflict *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
  }
  if (pyVar4 != new_buffer) {
    if ((lVar1 != 0) && (*(long *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8) != 0)) {
      **(undefined1 **)((long)yyscanner + 0x48) = *(undefined1 *)((long)yyscanner + 0x30);
      lVar1 = *(long *)((long)yyscanner + 0x18);
      lVar2 = *(long *)((long)yyscanner + 0x28);
      *(undefined8 *)(*(long *)(lVar2 + lVar1 * 8) + 0x10) = *(undefined8 *)((long)yyscanner + 0x48)
      ;
      *(undefined8 *)(*(long *)(lVar2 + lVar1 * 8) + 0x20) = *(undefined8 *)((long)yyscanner + 0x38)
      ;
    }
    lVar1 = *(long *)((long)yyscanner + 0x18);
    *(YY_BUFFER_STATE_conflict *)(*(long *)((long)yyscanner + 0x28) + lVar1 * 8) = new_buffer;
    lVar2 = *(long *)(*(long *)((long)yyscanner + 0x28) + lVar1 * 8);
    *(undefined8 *)((long)yyscanner + 0x38) = *(undefined8 *)(lVar2 + 0x20);
    puVar3 = *(undefined1 **)(lVar2 + 0x10);
    *(undefined1 **)((long)yyscanner + 0x48) = puVar3;
    *(undefined1 **)((long)yyscanner + 0x88) = puVar3;
    *(undefined8 *)((long)yyscanner + 8) =
         **(undefined8 **)(*(long *)((long)yyscanner + 0x28) + lVar1 * 8);
    *(undefined1 *)((long)yyscanner + 0x30) = *puVar3;
    *(undefined4 *)((long)yyscanner + 0x58) = 1;
  }
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack (yyscanner);
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state( yyscanner );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	yyg->yy_did_buffer_switch_on_eof = 1;
}